

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

bool stackjit::TypeSystem::fromString(string *typeName,PrimitiveTypes *primitiveType)

{
  bool bVar1;
  PrimitiveTypes *primitiveType_local;
  string *typeName_local;
  
  bVar1 = std::operator==(typeName,"Int");
  if (bVar1) {
    *primitiveType = Integer;
    typeName_local._7_1_ = true;
  }
  else {
    bVar1 = std::operator==(typeName,"Float");
    if (bVar1) {
      *primitiveType = Float;
      typeName_local._7_1_ = true;
    }
    else {
      bVar1 = std::operator==(typeName,"Bool");
      if (bVar1) {
        *primitiveType = Bool;
        typeName_local._7_1_ = true;
      }
      else {
        bVar1 = std::operator==(typeName,"Char");
        if (bVar1) {
          *primitiveType = Char;
          typeName_local._7_1_ = true;
        }
        else {
          bVar1 = std::operator==(typeName,"Void");
          if (bVar1) {
            *primitiveType = Void;
            typeName_local._7_1_ = true;
          }
          else {
            typeName_local._7_1_ = false;
          }
        }
      }
    }
  }
  return typeName_local._7_1_;
}

Assistant:

bool TypeSystem::fromString(std::string typeName, PrimitiveTypes& primitiveType) {
		if (typeName == "Int") {
			primitiveType = PrimitiveTypes::Integer;
			return true;
		} else if (typeName == "Float") {
			primitiveType = PrimitiveTypes::Float;
			return true;
		} else if (typeName == "Bool") {
			primitiveType = PrimitiveTypes::Bool;
			return true;
		} else if (typeName == "Char") {
			primitiveType = PrimitiveTypes::Char;
			return true;
		} else if (typeName == "Void") {
			primitiveType = PrimitiveTypes::Void;
			return true;
		}

		return false;
	}